

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O2

btVector3 __thiscall btMultiBody::getAngularMomentum(btMultiBody *this)

{
  int newsize;
  uint uVar1;
  btMultibodyLink *pbVar2;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  undefined4 extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  btVector3 bVar7;
  btQuadWord bVar8;
  btQuadWord local_d8;
  btAlignedObjectArray<btQuaternion> rot_from_world;
  undefined1 local_a8 [12];
  float fStack_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  btVector3 local_80;
  btAlignedObjectArray<btVector3> omega;
  btAlignedObjectArray<btVector3> vel;
  
  uVar1 = (this->m_links).m_size;
  omega.m_ownsMemory = true;
  omega.m_data = (btVector3 *)0x0;
  omega.m_size = 0;
  omega.m_capacity = 0;
  newsize = uVar1 + 1;
  btAlignedObjectArray<btVector3>::resize(&omega,newsize,(btVector3 *)&vel);
  vel.m_ownsMemory = true;
  vel.m_data = (btVector3 *)0x0;
  vel.m_size = 0;
  vel.m_capacity = 0;
  btAlignedObjectArray<btVector3>::resize(&vel,newsize,(btVector3 *)&rot_from_world);
  rot_from_world.m_ownsMemory = true;
  rot_from_world.m_data = (btQuaternion *)0x0;
  rot_from_world.m_size = 0;
  rot_from_world.m_capacity = 0;
  btAlignedObjectArray<btQuaternion>::resize(&rot_from_world,newsize,(btQuaternion *)&local_d8);
  compTreeLinkVelocities(this,omega.m_data,vel.m_data);
  uVar3 = *(undefined8 *)((this->m_baseQuat).super_btQuadWord.m_floats + 2);
  *(undefined8 *)((rot_from_world.m_data)->super_btQuadWord).m_floats =
       *(undefined8 *)(this->m_baseQuat).super_btQuadWord.m_floats;
  *(undefined8 *)(((rot_from_world.m_data)->super_btQuadWord).m_floats + 2) = uVar3;
  local_d8.m_floats = (btScalar  [4])btQuaternion::inverse(rot_from_world.m_data);
  local_80 = operator*(&this->m_baseInertia,omega.m_data);
  bVar7 = quatRotate((btQuaternion *)&local_d8,&local_80);
  local_a8._8_4_ = in_XMM1_Dc;
  local_a8._0_8_ = bVar7.m_floats._8_8_;
  fStack_9c = in_XMM1_Dd;
  fStack_90 = (float)extraout_XMM0_Dc;
  local_98 = (undefined1  [8])bVar7.m_floats._0_8_;
  fStack_8c = (float)extraout_XMM0_Dd;
  uVar5 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar5;
  }
  lVar4 = 0x10;
  for (; uVar6 * 600 - uVar5 != 0; uVar5 = uVar5 + 600) {
    pbVar2 = (this->m_links).m_data;
    bVar8.m_floats =
         (btScalar  [4])
         operator*((btQuaternion *)
                   ((long)(pbVar2->m_cachedRotParentToThis).super_btQuadWord.m_floats + uVar5),
                   rot_from_world.m_data +
                   (long)*(int *)((long)(pbVar2->m_zeroRotParentToThis).super_btQuadWord.m_floats +
                                 (uVar5 - 4)) + 1);
    *&((btQuadWord *)((long)((rot_from_world.m_data)->super_btQuadWord).m_floats + lVar4))->m_floats
         = bVar8.m_floats;
    local_d8.m_floats =
         (btScalar  [4])
         btQuaternion::inverse
                   ((btQuaternion *)
                    ((long)((rot_from_world.m_data)->super_btQuadWord).m_floats + lVar4));
    local_80 = operator*((btVector3 *)
                         ((long)(((this->m_links).m_data)->m_inertiaLocal).m_floats + uVar5),
                         (btVector3 *)((long)(omega.m_data)->m_floats + lVar4));
    bVar7 = quatRotate((btQuaternion *)&local_d8,&local_80);
    local_98._4_4_ = (float)local_98._4_4_ + bVar7.m_floats[1];
    local_98._0_4_ = (float)local_98._0_4_ + bVar7.m_floats[0];
    fStack_90 = fStack_90 + extraout_XMM0_Dc_00;
    fStack_8c = fStack_8c + extraout_XMM0_Dd_00;
    in_XMM1_Dc = in_XMM1_Dc + (float)local_a8._8_4_;
    in_XMM1_Dd = in_XMM1_Dd + fStack_9c;
    local_a8._0_4_ = bVar7.m_floats[2] + (float)local_a8._0_4_;
    local_a8._8_4_ = in_XMM1_Dc;
    fStack_9c = in_XMM1_Dd;
    lVar4 = lVar4 + 0x10;
  }
  btAlignedObjectArray<btQuaternion>::~btAlignedObjectArray(&rot_from_world);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&vel);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&omega);
  bVar7.m_floats[2] = (btScalar)local_a8._0_4_;
  bVar7.m_floats[3] = (btScalar)local_a8._4_4_;
  bVar7.m_floats[0] = (btScalar)local_98._0_4_;
  bVar7.m_floats[1] = (btScalar)local_98._4_4_;
  return (btVector3)bVar7.m_floats;
}

Assistant:

btVector3 btMultiBody::getAngularMomentum() const
{
	int num_links = getNumLinks();
    // TODO: would be better not to allocate memory here
    btAlignedObjectArray<btVector3> omega;omega.resize(num_links+1);
	btAlignedObjectArray<btVector3> vel;vel.resize(num_links+1);
    btAlignedObjectArray<btQuaternion> rot_from_world;rot_from_world.resize(num_links+1);
    compTreeLinkVelocities(&omega[0], &vel[0]);

    rot_from_world[0] = m_baseQuat;
    btVector3 result = quatRotate(rot_from_world[0].inverse() , (m_baseInertia * omega[0]));

    for (int i = 0; i < num_links; ++i) {
        rot_from_world[i+1] = m_links[i].m_cachedRotParentToThis * rot_from_world[m_links[i].m_parent+1];
        result += (quatRotate(rot_from_world[i+1].inverse() , (m_links[i].m_inertiaLocal * omega[i+1])));
    }

    return result;
}